

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::
initialize<init_common_expr(pybind11::class_<kratos::Var,std::shared_ptr<kratos::Var>>&)::__52,kratos::Expr&,kratos::Var_const&,long_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::return_value_policy>
          (cpp_function *this,type *f,_func_Expr_ptr_Var_ptr_long_ptr *param_2,name *extra,
          is_method *extra_1,sibling *extra_2,return_value_policy *extra_3)

{
  _func_handle_function_call_ptr *p_Var1;
  const_pointer types;
  bool is_function_ptr;
  bool has_arg_annotations;
  bool has_args;
  bool has_pos_only_args;
  bool has_kw_only_args;
  _lambda_pybind11__detail__function_call___1_ local_49;
  pointer local_48;
  pointer rec;
  unique_function_record unique_rec;
  sibling *extra_local_2;
  is_method *extra_local_1;
  name *extra_local;
  _func_Expr_ptr_Var_ptr_long_ptr *param_5_local;
  type *f_local;
  cpp_function *this_local;
  
  unique_rec._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
          )extra_2;
  make_function_record((cpp_function *)&rec);
  local_48 = std::
             unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
             ::get((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                    *)&rec);
  p_Var1 = initialize(init_common_expr(pybind11::class_&)::$_52&&,kratos::Expr&(*)(kratos::Var_const&,long_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::return_value_policy_const&)
           ::{lambda(pybind11::detail::function_call&)#1}::operator_cast_to_function_pointer
                     (&local_49);
  local_48->impl = p_Var1;
  pybind11::detail::
  process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::return_value_policy>
  ::init((EVP_PKEY_CTX *)extra);
  types = std::array<const_std::type_info_*,_3UL>::data
                    (&initialize<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/python/kratos_expr.cc:355:13),_kratos::Expr_&,_const_kratos::Var_&,_const_long_&,_pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::return_value_policy>
                      ::types);
  initialize_generic(this,(unique_function_record *)&rec,
                     initialize<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/python/kratos_expr.cc:355:13),_kratos::Expr_&,_const_kratos::Var_&,_const_long_&,_pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::return_value_policy>
                     ::signature.text,types,2);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&rec);
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...), const Extra&... extra) {
        using namespace detail;
        struct capture { remove_reference_t<Func> f; };

        /* Store the function including any extra state it might have (e.g. a lambda capture object) */
        // The unique_ptr makes sure nothing is leaked in case of an exception.
        auto unique_rec = make_function_record();
        auto rec = unique_rec.get();

        /* Store the capture object directly in the function record if there is enough space */
        if (PYBIND11_SILENCE_MSVC_C4127(sizeof(capture) <= sizeof(rec->data))) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
#if defined(__GNUG__) && __GNUC__ >= 6 && !defined(__clang__) && !defined(__INTEL_COMPILER)
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wplacement-new"
#endif
            new ((capture *) &rec->data) capture { std::forward<Func>(f) };
#if defined(__GNUG__) && __GNUC__ >= 6 && !defined(__clang__) && !defined(__INTEL_COMPILER)
#  pragma GCC diagnostic pop
#endif
#if defined(__GNUG__) && !PYBIND11_HAS_STD_LAUNDER && !defined(__INTEL_COMPILER)
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wstrict-aliasing"
#endif
            // UB without std::launder, but without breaking ABI and/or
            // a significant refactoring it's "impossible" to solve.
            if (!std::is_trivially_destructible<capture>::value)
                rec->free_data = [](function_record *r) {
                    auto data = PYBIND11_STD_LAUNDER((capture *) &r->data);
                    (void) data;
                    data->~capture();
                };
#if defined(__GNUG__) && !PYBIND11_HAS_STD_LAUNDER && !defined(__INTEL_COMPILER)
#  pragma GCC diagnostic pop
#endif
        } else {
            rec->data[0] = new capture { std::forward<Func>(f) };
            rec->free_data = [](function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = argument_loader<Args...>;
        using cast_out = make_caster<
            conditional_t<std::is_void<Return>::value, void_type, Return>
        >;

        static_assert(expected_num_args<Extra...>(sizeof...(Args), cast_in::has_args, cast_in::has_kwargs),
                      "The number of argument annotations does not match the number of function arguments");

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](function_call &call) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(call))
                return PYBIND11_TRY_NEXT_OVERLOAD;

            /* Invoke call policy pre-call hook */
            process_attributes<Extra...>::precall(call);

            /* Get a pointer to the capture object */
            auto data = (sizeof(capture) <= sizeof(call.func.data)
                         ? &call.func.data : call.func.data[0]);
            auto *cap = const_cast<capture *>(reinterpret_cast<const capture *>(data));

            /* Override policy for rvalues -- usually to enforce rvp::move on an rvalue */
            return_value_policy policy = return_value_policy_override<Return>::policy(call.func.policy);

            /* Function scope guard -- defaults to the compile-to-nothing `void_type` */
            using Guard = extract_guard_t<Extra...>;

            /* Perform the function call */
            handle result = cast_out::cast(
                std::move(args_converter).template call<Return, Guard>(cap->f), policy, call.parent);

            /* Invoke call policy post-call hook */
            process_attributes<Extra...>::postcall(call, result);

            return result;
        };

        /* Process any user-provided function attributes */
        process_attributes<Extra...>::init(extra..., rec);

        {
            constexpr bool has_kw_only_args = any_of<std::is_same<kw_only, Extra>...>::value,
                           has_pos_only_args = any_of<std::is_same<pos_only, Extra>...>::value,
                           has_args = any_of<std::is_same<args, Args>...>::value,
                           has_arg_annotations = any_of<is_keyword<Extra>...>::value;
            static_assert(has_arg_annotations || !has_kw_only_args, "py::kw_only requires the use of argument annotations");
            static_assert(has_arg_annotations || !has_pos_only_args, "py::pos_only requires the use of argument annotations (for docstrings and aligning the annotations to the argument)");
            static_assert(!(has_args && has_kw_only_args), "py::kw_only cannot be combined with a py::args argument");
        }

        /* Generate a readable signature describing the function's arguments and return value types */
        static constexpr auto signature = _("(") + cast_in::arg_names + _(") -> ") + cast_out::name;
        PYBIND11_DESCR_CONSTEXPR auto types = decltype(signature)::types();

        /* Register the function with Python from generic (non-templated) code */
        // Pass on the ownership over the `unique_rec` to `initialize_generic`. `rec` stays valid.
        initialize_generic(std::move(unique_rec), signature.text, types.data(), sizeof...(Args));

        if (cast_in::has_args) rec->has_args = true;
        if (cast_in::has_kwargs) rec->has_kwargs = true;

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...);
        constexpr bool is_function_ptr =
            std::is_convertible<Func, FunctionType>::value &&
            sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1] = const_cast<void *>(reinterpret_cast<const void *>(&typeid(FunctionType)));
        }
    }